

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

uint32_t __thiscall
basisu::basisu_frontend::refine_block_endpoints_given_selectors(basisu_frontend *this)

{
  uint uVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  uint32_t uVar5;
  uint *puVar6;
  pixel_block *this_00;
  long in_RDI;
  color_rgba colors [2];
  bool success;
  uint32_t b [2];
  uint32_t g [2];
  uint32_t r [2];
  uint16_t delta_color3;
  uint16_t base_color5;
  etc_block *blk_1;
  uint32_t subblock_index_1;
  uint32_t block_index_2;
  uint32_t training_vector_index_1;
  uint32_t subblock_iter_1;
  uint32_t pass;
  bool all_passed5;
  uint32_t num_passes;
  uint32_t use_individual_mode_2;
  params cluster_optimizer_params;
  etc1_solution_coordinates solutions [2];
  etc1_optimizer optimizer;
  uint32_t total_pixels;
  uint32_t use_individual_mode_1;
  vector<unsigned_char> cluster_selectors [2];
  bool results_valid [2];
  results cluster_optimizer_results [2];
  etc_coord2 *coords;
  uint32_t pixel_index;
  uint32_t i;
  color_rgba unpacked_block_pixels [16];
  color_rgba *pSource_block_pixels;
  bool use_individual_mode;
  etc_block *blk;
  bool is_flipped;
  uint32_t subblock_index;
  uint32_t block_index_1;
  uint32_t training_vector_index;
  uint32_t subblock_iter;
  uint64_t cur_subblock_err [2];
  uint8_vec subblock_selectors [2];
  vector<basisu::color_rgba> subblock_colors [2];
  uint_vec *subblocks;
  endpoint_cluster_etc_params *subblock_params;
  uint32_t endpoint_cluster_index;
  uint32_t total_subblocks_examined;
  uint32_t total_subblocks_refined;
  vec2U *endpoint_clusters;
  int block_index;
  undefined2 in_stack_fffffffffffff9e8;
  uint16_t in_stack_fffffffffffff9ea;
  undefined1 in_stack_fffffffffffff9ec;
  undefined1 in_stack_fffffffffffff9ed;
  undefined1 in_stack_fffffffffffff9ee;
  undefined1 in_stack_fffffffffffff9ef;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  uint32_t in_stack_fffffffffffff9f8;
  uint32_t in_stack_fffffffffffff9fc;
  vector<basisu::color_rgba> *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  uint16_t in_stack_fffffffffffffa0c;
  undefined1 in_stack_fffffffffffffa0e;
  undefined1 in_stack_fffffffffffffa0f;
  etc_block *in_stack_fffffffffffffa10;
  color_rgba *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  uint32_t in_stack_fffffffffffffa30;
  etc1_optimizer *in_stack_fffffffffffffa40;
  etc1_optimizer *local_5b8;
  vector<unsigned_char> *local_5a0;
  vector<unsigned_char> *local_588;
  uchar *in_stack_fffffffffffffab8;
  color_rgba *in_stack_fffffffffffffac0;
  etc_block *in_stack_fffffffffffffac8;
  undefined1 *local_520;
  vector<unsigned_char> *local_4e8;
  uint64_t *local_4d0;
  color_rgba *local_488;
  vector<unsigned_char> *local_438;
  vector<basisu::color_rgba> *local_418;
  uint local_3e4 [6];
  uint16_t local_3cc;
  uint16_t local_3ca;
  etc_block *local_3c8;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  byte local_3a5;
  uint local_3a4;
  uint local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  byte local_394;
  uint32_t local_38c;
  etc_block *local_388;
  undefined1 local_380;
  color_rgba *local_360;
  undefined1 local_358 [24];
  etc1_optimizer local_340;
  uint32_t local_1c0;
  uint local_1bc;
  vector<unsigned_char> local_1b8 [2];
  vector<unsigned_char> vStack_198;
  uint64_t local_188;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_180;
  uint32_t local_17c;
  uint32_t auStack_178 [2];
  uint64_t auStack_170 [3];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_158;
  uint32_t local_154;
  uint64_t uStack_138;
  undefined1 local_129;
  long local_128;
  undefined4 local_120;
  uint local_11c;
  color_rgba local_118 [16];
  color_rgba *local_d8;
  byte local_c9;
  etc_block *local_c8;
  undefined1 local_b9;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  ulong local_a8 [2];
  vector<unsigned_char> local_98 [2];
  vector<unsigned_char> vStack_78;
  undefined1 local_68 [32];
  undefined1 auStack_48 [28];
  float local_2c;
  uint local_28;
  uint local_24;
  uint32_t local_20;
  uint32_t local_1c;
  vec2U *local_18;
  uint32_t local_c;
  
  debug_printf("refine_block_endpoints_given_selectors\n");
  for (local_c = 0; (int)local_c < *(int *)(in_RDI + 0x40); local_c = local_c + 1) {
    local_18 = vector<basisu::vec2U>::operator[]
                         ((vector<basisu::vec2U> *)
                          CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                          CONCAT17(in_stack_fffffffffffff9ef,
                                   CONCAT16(in_stack_fffffffffffff9ee,
                                            CONCAT15(in_stack_fffffffffffff9ed,
                                                     CONCAT14(in_stack_fffffffffffff9ec,
                                                              CONCAT22(in_stack_fffffffffffff9ea,
                                                                       in_stack_fffffffffffff9e8))))
                                  ));
    vec2U::operator[]((vec2U *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                      CONCAT13(in_stack_fffffffffffff9ef,
                               CONCAT12(in_stack_fffffffffffff9ee,
                                        CONCAT11(in_stack_fffffffffffff9ed,in_stack_fffffffffffff9ec
                                                ))));
    vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
              ((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)
               CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               CONCAT17(in_stack_fffffffffffff9ef,
                        CONCAT16(in_stack_fffffffffffff9ee,
                                 CONCAT15(in_stack_fffffffffffff9ed,
                                          CONCAT14(in_stack_fffffffffffff9ec,
                                                   CONCAT22(in_stack_fffffffffffff9ea,
                                                            in_stack_fffffffffffff9e8))))));
    local_1c = local_c << 1;
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)in_stack_fffffffffffffa00,
               (uint *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    vec2U::operator[]((vec2U *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                      CONCAT13(in_stack_fffffffffffff9ef,
                               CONCAT12(in_stack_fffffffffffff9ee,
                                        CONCAT11(in_stack_fffffffffffff9ed,in_stack_fffffffffffff9ec
                                                ))));
    vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
              ((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)
               CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               CONCAT17(in_stack_fffffffffffff9ef,
                        CONCAT16(in_stack_fffffffffffff9ee,
                                 CONCAT15(in_stack_fffffffffffff9ed,
                                          CONCAT14(in_stack_fffffffffffff9ec,
                                                   CONCAT22(in_stack_fffffffffffff9ea,
                                                            in_stack_fffffffffffff9e8))))));
    local_20 = local_c * 2 + 1;
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)in_stack_fffffffffffffa00,
               (uint *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  }
  local_24 = 0;
  local_28 = 0;
  local_2c = 0.0;
  do {
    fVar2 = local_2c;
    fVar4 = (float)vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::size
                             ((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)
                              (in_RDI + 0x100));
    if ((uint)fVar4 <= (uint)fVar2) {
      if ((*(byte *)(in_RDI + 0x1d) & 1) != 0) {
        debug_printf((char *)(double)(((float)local_24 * 100.0) / (float)local_28),
                     "Total subblock endpoints refined: %u (%3.1f%%)\n",(ulong)local_24);
      }
      return local_24;
    }
    auStack_48._16_8_ =
         vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                   ((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)
                    CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                    CONCAT17(in_stack_fffffffffffff9ef,
                             CONCAT16(in_stack_fffffffffffff9ee,
                                      CONCAT15(in_stack_fffffffffffff9ed,
                                               CONCAT14(in_stack_fffffffffffff9ec,
                                                        CONCAT22(in_stack_fffffffffffff9ea,
                                                                 in_stack_fffffffffffff9e8))))));
    auStack_48._8_8_ = &((endpoint_cluster_etc_params *)auStack_48._16_8_)->m_subblocks;
    local_418 = (vector<basisu::color_rgba> *)local_68;
    do {
      vector<basisu::color_rgba>::vector(local_418);
      local_418 = local_418 + 1;
    } while (local_418 != (vector<basisu::color_rgba> *)auStack_48);
    local_438 = local_98;
    do {
      vector<unsigned_char>::vector(local_438);
      local_438 = local_438 + 1;
    } while (local_438 != &vStack_78);
    memset(local_a8,0,0x10);
    for (local_ac = 0; uVar1 = local_ac,
        uVar5 = vector<unsigned_int>::size((vector<unsigned_int> *)auStack_48._8_8_), uVar1 < uVar5;
        local_ac = local_ac + 1) {
      puVar6 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)
                          CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                          CONCAT17(in_stack_fffffffffffff9ef,
                                   CONCAT16(in_stack_fffffffffffff9ee,
                                            CONCAT15(in_stack_fffffffffffff9ed,
                                                     CONCAT14(in_stack_fffffffffffff9ec,
                                                              CONCAT22(in_stack_fffffffffffff9ea,
                                                                       in_stack_fffffffffffff9e8))))
                                  ));
      local_b0 = *puVar6;
      local_b4 = local_b0 >> 1;
      local_b8 = local_b0 & 1;
      local_b9 = 1;
      local_c8 = vector<basisu::etc_block>::operator[]
                           ((vector<basisu::etc_block> *)
                            CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                            CONCAT17(in_stack_fffffffffffff9ef,
                                     CONCAT16(in_stack_fffffffffffff9ee,
                                              CONCAT15(in_stack_fffffffffffff9ed,
                                                       CONCAT14(in_stack_fffffffffffff9ec,
                                                                CONCAT22(in_stack_fffffffffffff9ea,
                                                                         in_stack_fffffffffffff9e8))
                                                      ))));
      bVar3 = etc_block::get_diff_bit(local_c8);
      local_c9 = ~bVar3 & 1;
      this_00 = get_source_pixel_block
                          ((basisu_frontend *)
                           CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                           CONCAT13(in_stack_fffffffffffff9ef,
                                    CONCAT12(in_stack_fffffffffffff9ee,
                                             CONCAT11(in_stack_fffffffffffff9ed,
                                                      in_stack_fffffffffffff9ec))));
      local_d8 = pixel_block::get_ptr(this_00);
      local_488 = local_118;
      do {
        color_rgba::color_rgba(local_488);
        local_488 = local_488 + 1;
      } while (local_488 != (color_rgba *)&local_d8);
      unpack_etc1(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                  SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
      for (local_11c = 0; local_11c < 8; local_11c = local_11c + 1) {
        local_120 = *(undefined4 *)((ulong)local_b8 * 0x20 + 0x6a83d0 + (ulong)local_11c * 4);
        local_128 = (ulong)local_b8 * 0x10 + 0x6a8370 + (ulong)local_11c * 2;
        vector<basisu::color_rgba>::push_back
                  (in_stack_fffffffffffffa00,
                   (color_rgba *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        uVar5 = color_distance(SUB41((uint)in_stack_fffffffffffffa20 >> 0x18,0),
                               in_stack_fffffffffffffa18,(color_rgba *)in_stack_fffffffffffffa10,
                               (bool)in_stack_fffffffffffffa0f);
        local_a8[local_c9 & 1] = local_a8[local_c9 & 1] + (ulong)uVar5;
        uVar5 = etc_block::get_selector
                          ((etc_block *)
                           CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                           CONCAT13(in_stack_fffffffffffff9ef,
                                    CONCAT12(in_stack_fffffffffffff9ee,
                                             CONCAT11(in_stack_fffffffffffff9ed,
                                                      in_stack_fffffffffffff9ec))),
                           CONCAT22(in_stack_fffffffffffff9ea,in_stack_fffffffffffff9e8));
        local_129 = (undefined1)uVar5;
        vector<unsigned_char>::push_back
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa00,
                   (uchar *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      }
    }
    local_4d0 = &local_188;
    do {
      etc1_optimizer::results::results((results *)0x4e8e2f);
      local_4d0 = local_4d0 + 5;
    } while (local_4d0 != &uStack_138);
    vStack_198.m_capacity._2_2_ = 0;
    clear_obj<basisu::etc1_optimizer::results[2]>((results (*) [2])0x4e8e69);
    local_4e8 = local_1b8;
    do {
      vector<unsigned_char>::vector(local_4e8);
      local_4e8 = local_4e8 + 1;
    } while (local_4e8 != &vStack_198);
    for (local_1bc = 0; local_1bc < 2; local_1bc = local_1bc + 1) {
      local_1c0 = vector<basisu::color_rgba>::size
                            ((vector<basisu::color_rgba> *)(local_68 + (ulong)local_1bc * 0x10));
      if (local_1c0 != 0) {
        local_28 = local_28 + (local_1c0 >> 3);
        etc1_optimizer::etc1_optimizer(in_stack_fffffffffffffa40);
        local_520 = local_358;
        do {
          etc1_solution_coordinates::etc1_solution_coordinates
                    ((etc1_solution_coordinates *)
                     CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
          local_520 = local_520 + 0xc;
        } while (local_520 != local_358 + 0x18);
        etc1_optimizer::params::params
                  ((params *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
        local_38c = local_1c0;
        in_stack_fffffffffffffac8 =
             (etc_block *)
             vector<basisu::color_rgba>::operator[]
                       ((vector<basisu::color_rgba> *)
                        CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                        CONCAT17(in_stack_fffffffffffff9ef,
                                 CONCAT16(in_stack_fffffffffffff9ee,
                                          CONCAT15(in_stack_fffffffffffff9ed,
                                                   CONCAT14(in_stack_fffffffffffff9ec,
                                                            CONCAT22(in_stack_fffffffffffff9ea,
                                                                     in_stack_fffffffffffff9e8))))))
        ;
        local_380 = local_1bc != 0;
        local_394 = *(byte *)(in_RDI + 0x1c) & 1;
        local_388 = in_stack_fffffffffffffac8;
        in_stack_fffffffffffffac0 =
             (color_rgba *)
             vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)
                        CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                        CONCAT17(in_stack_fffffffffffff9ef,
                                 CONCAT16(in_stack_fffffffffffff9ee,
                                          CONCAT15(in_stack_fffffffffffff9ed,
                                                   CONCAT14(in_stack_fffffffffffff9ec,
                                                            CONCAT22(in_stack_fffffffffffff9ea,
                                                                     in_stack_fffffffffffff9e8))))))
        ;
        local_398 = 3;
        local_360 = in_stack_fffffffffffffac0;
        vector<unsigned_char>::resize
                  ((vector<unsigned_char> *)in_stack_fffffffffffffa00,
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (bool)in_stack_fffffffffffff9f7);
        auStack_178[(ulong)local_1bc * 10] = local_1c0;
        in_stack_fffffffffffffab8 =
             vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)
                        CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                        CONCAT17(in_stack_fffffffffffff9ef,
                                 CONCAT16(in_stack_fffffffffffff9ee,
                                          CONCAT15(in_stack_fffffffffffff9ed,
                                                   CONCAT14(in_stack_fffffffffffff9ec,
                                                            CONCAT22(in_stack_fffffffffffff9ea,
                                                                     in_stack_fffffffffffff9e8))))))
        ;
        auStack_170[(ulong)local_1bc * 5] = (uint64_t)in_stack_fffffffffffffab8;
        etc1_optimizer::init((etc1_optimizer *)(local_358 + 0x18),(EVP_PKEY_CTX *)&local_398);
        bVar3 = etc1_optimizer::compute
                          ((etc1_optimizer *)
                           CONCAT17(in_stack_fffffffffffffa0f,
                                    CONCAT16(in_stack_fffffffffffffa0e,
                                             CONCAT24(in_stack_fffffffffffffa0c,
                                                      in_stack_fffffffffffffa08))));
        if (bVar3) {
          if ((&local_188)[(ulong)local_1bc * 5] < local_a8[local_1bc]) {
            *(undefined1 *)((long)&vStack_198.m_capacity + (ulong)local_1bc + 2) = 1;
          }
          local_39c = 0;
        }
        else {
          local_39c = 0x10;
        }
        etc1_optimizer::~etc1_optimizer
                  ((etc1_optimizer *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
      }
    }
    for (local_3a0 = 0; local_3a0 < 2; local_3a0 = local_3a0 + 1) {
      if ((*(byte *)((long)&vStack_198.m_capacity + (ulong)local_3a0 + 2) & 1) != 0) {
        local_3a4 = 2;
        if (local_3a0 != 0) {
          local_3a4 = 1;
        }
        local_3a5 = 1;
        for (local_3ac = 0; local_3ac < local_3a4; local_3ac = local_3ac + 1) {
          for (local_3b0 = 0; uVar1 = local_3b0,
              uVar5 = vector<unsigned_int>::size((vector<unsigned_int> *)auStack_48._8_8_),
              uVar1 < uVar5; local_3b0 = local_3b0 + 1) {
            puVar6 = vector<unsigned_int>::operator[]
                               ((vector<unsigned_int> *)
                                CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                                CONCAT17(in_stack_fffffffffffff9ef,
                                         CONCAT16(in_stack_fffffffffffff9ee,
                                                  CONCAT15(in_stack_fffffffffffff9ed,
                                                           CONCAT14(in_stack_fffffffffffff9ec,
                                                                    CONCAT22(
                                                  in_stack_fffffffffffff9ea,
                                                  in_stack_fffffffffffff9e8))))));
            local_3b4 = *puVar6;
            local_3b8 = local_3b4 >> 1;
            local_3bc = local_3b4 & 1;
            local_3c8 = vector<basisu::etc_block>::operator[]
                                  ((vector<basisu::etc_block> *)
                                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                                   CONCAT17(in_stack_fffffffffffff9ef,
                                            CONCAT16(in_stack_fffffffffffff9ee,
                                                     CONCAT15(in_stack_fffffffffffff9ed,
                                                              CONCAT14(in_stack_fffffffffffff9ec,
                                                                       CONCAT22(
                                                  in_stack_fffffffffffff9ea,
                                                  in_stack_fffffffffffff9e8))))));
            bVar3 = etc_block::get_diff_bit(local_3c8);
            if ((bool)((bVar3 ^ 0xffU) & 1) == (local_3a0 != 0)) {
              if (local_3a0 == 0) {
                local_3ca = etc_block::get_base5_color((etc_block *)in_stack_fffffffffffffa00);
                local_3cc = etc_block::get_delta3_color((etc_block *)in_stack_fffffffffffffa00);
                etc_block::unpack_color5
                          ((uint32_t *)in_stack_fffffffffffffa00,
                           (uint32_t *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)
                           ,(uint32_t *)
                            CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                           CONCAT11(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9ee),
                           (bool)in_stack_fffffffffffff9ed);
                in_stack_fffffffffffff9e8 = 0xff;
                in_stack_fffffffffffff9ea = 0;
                bVar3 = etc_block::unpack_color5
                                  ((uint32_t *)
                                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                                   (uint32_t *)in_stack_fffffffffffffa18,
                                   (uint32_t *)in_stack_fffffffffffffa10,
                                   CONCAT11(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa0e),
                                   in_stack_fffffffffffffa0c,
                                   SUB41((uint)in_stack_fffffffffffffa08 >> 0x18,0),
                                   in_stack_fffffffffffffa30);
                if (!bVar3) {
                  __assert_fail("success",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp"
                                ,0xb72,
                                "uint32_t basisu::basisu_frontend::refine_block_endpoints_given_selectors()"
                               );
                }
                local_3e4[(ulong)local_3bc + 4] = (uint)local_180 & 0xff;
                local_3e4[(ulong)local_3bc + 2] = (uint)local_180 >> 8 & 0xff;
                local_3e4[local_3bc] = (uint)local_180 >> 0x10 & 0xff;
                color_rgba::color_rgba
                          ((color_rgba *)
                           CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                           CONCAT13(in_stack_fffffffffffff9ef,
                                    CONCAT12(in_stack_fffffffffffff9ee,
                                             CONCAT11(in_stack_fffffffffffff9ed,
                                                      in_stack_fffffffffffff9ec))),
                           CONCAT22(in_stack_fffffffffffff9ea,in_stack_fffffffffffff9e8),0,0x4e960d)
                ;
                color_rgba::color_rgba
                          ((color_rgba *)
                           CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                           CONCAT13(in_stack_fffffffffffff9ef,
                                    CONCAT12(in_stack_fffffffffffff9ee,
                                             CONCAT11(in_stack_fffffffffffff9ed,
                                                      in_stack_fffffffffffff9ec))),
                           CONCAT22(in_stack_fffffffffffff9ea,in_stack_fffffffffffff9e8),0,0x4e9637)
                ;
                bVar3 = etc_block::try_pack_color5_delta3
                                  ((color_rgba *)
                                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
                if (!bVar3) {
                  local_3a5 = 0;
                  break;
                }
                if ((local_3ac == 1) && ((local_3a5 & 1) != 0)) {
                  etc_block::set_block_color5
                            (in_stack_fffffffffffffa10,
                             (color_rgba *)
                             CONCAT17(in_stack_fffffffffffffa0f,
                                      CONCAT16(in_stack_fffffffffffffa0e,
                                               CONCAT24(in_stack_fffffffffffffa0c,
                                                        in_stack_fffffffffffffa08))),
                             (color_rgba *)in_stack_fffffffffffffa00);
                  etc_block::set_inten_table
                            ((etc_block *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                             in_stack_fffffffffffff9f8);
                  *(uint64_t *)(auStack_48._16_8_ + 0x10) = local_188;
                  *(uint32_t *)(auStack_48._16_8_ + 8) = local_17c;
                  ((color_rgba *)auStack_48._16_8_)->field_0 = local_180;
                  local_24 = local_24 + 1;
                }
              }
              else {
                etc_block::pack_color4
                          ((color_rgba *)
                           CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                           (bool)in_stack_fffffffffffff9ef,
                           CONCAT22(in_stack_fffffffffffff9ea,in_stack_fffffffffffff9e8));
                etc_block::set_base4_color
                          ((etc_block *)
                           CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                           CONCAT13(in_stack_fffffffffffff9ef,
                                    CONCAT12(in_stack_fffffffffffff9ee,
                                             CONCAT11(in_stack_fffffffffffff9ed,
                                                      in_stack_fffffffffffff9ec))),
                           in_stack_fffffffffffff9ea);
                etc_block::set_inten_table
                          ((etc_block *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                           in_stack_fffffffffffff9f8);
                ((uint64_t *)(auStack_48._16_8_ + 0x10))[1] = auStack_170[2];
                ((uint32_t *)(auStack_48._16_8_ + 8))[1] = local_154;
                ((color_rgba *)auStack_48._16_8_)[1].field_0 = local_158;
                local_24 = local_24 + 1;
              }
            }
          }
        }
      }
    }
    local_588 = &vStack_198;
    do {
      local_588 = local_588 + -1;
      vector<unsigned_char>::~vector
                ((vector<unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    } while (local_588 != local_1b8);
    local_5a0 = &vStack_78;
    do {
      local_5a0 = local_5a0 + -1;
      vector<unsigned_char>::~vector
                ((vector<unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    } while (local_5a0 != local_98);
    in_stack_fffffffffffffa40 = (etc1_optimizer *)local_68;
    local_5b8 = (etc1_optimizer *)auStack_48;
    do {
      local_5b8 = (etc1_optimizer *)(local_5b8[-1].m_solutions_tried + 0x70);
      vector<basisu::color_rgba>::~vector
                ((vector<basisu::color_rgba> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    } while (local_5b8 != in_stack_fffffffffffffa40);
    local_2c = (float)((int)local_2c + 1);
  } while( true );
}

Assistant:

uint32_t basisu_frontend::refine_block_endpoints_given_selectors()
	{
		debug_printf("refine_block_endpoints_given_selectors\n");
				
		for (int block_index = 0; block_index < static_cast<int>(m_total_blocks); block_index++)
		{
			//uint32_t selector_cluster = m_block_selector_cluster_index(block_x, block_y);
			vec2U &endpoint_clusters = m_block_endpoint_clusters_indices[block_index];

			m_endpoint_cluster_etc_params[endpoint_clusters[0]].m_subblocks.push_back(block_index * 2);

			m_endpoint_cluster_etc_params[endpoint_clusters[1]].m_subblocks.push_back(block_index * 2 + 1);
		}

		uint32_t total_subblocks_refined = 0;
		uint32_t total_subblocks_examined = 0;

		for (uint32_t endpoint_cluster_index = 0; endpoint_cluster_index < m_endpoint_cluster_etc_params.size(); endpoint_cluster_index++)
		{
			endpoint_cluster_etc_params &subblock_params = m_endpoint_cluster_etc_params[endpoint_cluster_index];

			const uint_vec &subblocks = subblock_params.m_subblocks;
			//uint32_t total_pixels = subblock.m_subblocks.size() * 8;

			basisu::vector<color_rgba> subblock_colors[2]; // [use_individual_mode]
			uint8_vec subblock_selectors[2];

			uint64_t cur_subblock_err[2] = { 0, 0 };

			for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
			{
				uint32_t training_vector_index = subblocks[subblock_iter];

				uint32_t block_index = training_vector_index >> 1;
				uint32_t subblock_index = training_vector_index & 1;
				const bool is_flipped = true;

				const etc_block &blk = m_encoded_blocks[block_index];

				const bool use_individual_mode = !blk.get_diff_bit();

				const color_rgba *pSource_block_pixels = get_source_pixel_block(block_index).get_ptr();

				color_rgba unpacked_block_pixels[16];
				unpack_etc1(blk, unpacked_block_pixels);

				for (uint32_t i = 0; i < 8; i++)
				{
					const uint32_t pixel_index = g_etc1_pixel_indices[is_flipped][subblock_index][i];
					const etc_coord2 &coords = g_etc1_pixel_coords[is_flipped][subblock_index][i];

					subblock_colors[use_individual_mode].push_back(pSource_block_pixels[pixel_index]);

					cur_subblock_err[use_individual_mode] += color_distance(m_params.m_perceptual, pSource_block_pixels[pixel_index], unpacked_block_pixels[pixel_index], false);

					subblock_selectors[use_individual_mode].push_back(static_cast<uint8_t>(blk.get_selector(coords.m_x, coords.m_y)));
				}
			} // subblock_iter

			etc1_optimizer::results cluster_optimizer_results[2];
			bool results_valid[2] = { false, false };

			clear_obj(cluster_optimizer_results);

			basisu::vector<uint8_t> cluster_selectors[2];

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				const uint32_t total_pixels = (uint32_t)subblock_colors[use_individual_mode].size();

				if (!total_pixels)
					continue;

				total_subblocks_examined += total_pixels / 8;

				etc1_optimizer optimizer;
				etc1_solution_coordinates solutions[2];

				etc1_optimizer::params cluster_optimizer_params;
				cluster_optimizer_params.m_num_src_pixels = total_pixels;
				cluster_optimizer_params.m_pSrc_pixels = &subblock_colors[use_individual_mode][0];

				cluster_optimizer_params.m_use_color4 = use_individual_mode != 0;
				cluster_optimizer_params.m_perceptual = m_params.m_perceptual;

				cluster_optimizer_params.m_pForce_selectors = &subblock_selectors[use_individual_mode][0];
				cluster_optimizer_params.m_quality = cETCQualityUber;

				cluster_selectors[use_individual_mode].resize(total_pixels);

				cluster_optimizer_results[use_individual_mode].m_n = total_pixels;
				cluster_optimizer_results[use_individual_mode].m_pSelectors = &cluster_selectors[use_individual_mode][0];

				optimizer.init(cluster_optimizer_params, cluster_optimizer_results[use_individual_mode]);

				if (!optimizer.compute())
					continue;

				if (cluster_optimizer_results[use_individual_mode].m_error < cur_subblock_err[use_individual_mode])
					results_valid[use_individual_mode] = true;

			} // use_individual_mode

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				if (!results_valid[use_individual_mode])
					continue;

				uint32_t num_passes = use_individual_mode ? 1 : 2;

				bool all_passed5 = true;

				for (uint32_t pass = 0; pass < num_passes; pass++)
				{
					for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
					{
						const uint32_t training_vector_index = subblocks[subblock_iter];

						const uint32_t block_index = training_vector_index >> 1;
						const uint32_t subblock_index = training_vector_index & 1;
						//const bool is_flipped = true;

						etc_block &blk = m_encoded_blocks[block_index];

						if (!blk.get_diff_bit() != static_cast<bool>(use_individual_mode != 0))
							continue;

						if (use_individual_mode)
						{
							blk.set_base4_color(subblock_index, etc_block::pack_color4(cluster_optimizer_results[1].m_block_color_unscaled, false));
							blk.set_inten_table(subblock_index, cluster_optimizer_results[1].m_block_inten_table);

							subblock_params.m_color_error[1] = cluster_optimizer_results[1].m_error;
							subblock_params.m_inten_table[1] = cluster_optimizer_results[1].m_block_inten_table;
							subblock_params.m_color_unscaled[1] = cluster_optimizer_results[1].m_block_color_unscaled;

							total_subblocks_refined++;
						}
						else
						{
							const uint16_t base_color5 = blk.get_base5_color();
							const uint16_t delta_color3 = blk.get_delta3_color();

							uint32_t r[2], g[2], b[2];
							etc_block::unpack_color5(r[0], g[0], b[0], base_color5, false);
							bool success = etc_block::unpack_color5(r[1], g[1], b[1], base_color5, delta_color3, false);
							assert(success);
							BASISU_NOTE_UNUSED(success);

							r[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.r;
							g[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.g;
							b[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.b;

							color_rgba colors[2] = { color_rgba(r[0], g[0], b[0], 255), color_rgba(r[1], g[1], b[1], 255) };

							if (!etc_block::try_pack_color5_delta3(colors))
							{
								all_passed5 = false;
								break;
							}

							if ((pass == 1) && (all_passed5))
							{
								blk.set_block_color5(colors[0], colors[1]);
								blk.set_inten_table(subblock_index, cluster_optimizer_results[0].m_block_inten_table);

								subblock_params.m_color_error[0] = cluster_optimizer_results[0].m_error;
								subblock_params.m_inten_table[0] = cluster_optimizer_results[0].m_block_inten_table;
								subblock_params.m_color_unscaled[0] = cluster_optimizer_results[0].m_block_color_unscaled;

								total_subblocks_refined++;
							}
						}

					} // subblock_iter

				} // pass

			} // use_individual_mode

		} // endpoint_cluster_index

		if (m_params.m_debug_stats)
			debug_printf("Total subblock endpoints refined: %u (%3.1f%%)\n", total_subblocks_refined, total_subblocks_refined * 100.0f / total_subblocks_examined);
				
		return total_subblocks_refined;
	}